

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RndFun.cpp
# Opt level: O3

void Theta(Sarray *A,Sarray *B,vector<unsigned_long,_std::allocator<unsigned_long>_> *C,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *D)

{
  long lVar1;
  pointer pvVar2;
  pointer puVar3;
  ulong *puVar4;
  pointer puVar5;
  long lVar6;
  pointer pvVar7;
  int y;
  ulong uVar8;
  long lVar9;
  long lVar10;
  
  pvVar2 = (A->
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  puVar3 = (C->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar6 = 0;
  pvVar7 = pvVar2;
  do {
    puVar4 = (pvVar7->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar3[lVar6] = puVar4[3] ^ puVar4[1] ^ puVar4[2] ^ *puVar4 ^ puVar4[4];
    lVar6 = lVar6 + 1;
    pvVar7 = pvVar7 + 1;
  } while (lVar6 != 5);
  puVar5 = (D->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar6 = 0;
  do {
    uVar8 = (ulong)((int)lVar6 - 1);
    if (lVar6 == 0) {
      uVar8 = 4;
    }
    lVar1 = lVar6 + 1;
    lVar10 = 0;
    if (lVar6 != 4) {
      lVar10 = lVar1;
    }
    puVar5[lVar6] = (puVar3[lVar10] << 1 | (ulong)((long)puVar3[lVar10] < 0)) ^ puVar3[uVar8];
    lVar6 = lVar1;
  } while (lVar1 != 5);
  pvVar7 = (B->
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar6 = 0;
  do {
    lVar1 = *(long *)&pvVar2[lVar6].
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl;
    lVar10 = *(long *)&pvVar7[lVar6].
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data;
    lVar9 = 0;
    do {
      *(unsigned_long *)(lVar10 + lVar9 * 8) = puVar5[lVar6] ^ *(ulong *)(lVar1 + lVar9 * 8);
      lVar9 = lVar9 + 1;
    } while (lVar9 != 5);
    lVar6 = lVar6 + 1;
  } while (lVar6 != 5);
  return;
}

Assistant:

void Theta(Sarray &A, Sarray &B, vector<uint64_t> &C, vector<uint64_t> &D){
    for(int x=0;x<5;x++){
        C[x] = A[x][0]^A[x][1]^A[x][2]^A[x][3]^A[x][4];
    }

    for(int x=0;x<5;x++){
        D[x] = (C[(x+4)%5])^(rot(C[(x+1)%5],1));
    }

    for(int x=0;x<5;x++){
        for(int y=0;y<5;y++){
            B[x][y] = A[x][y] ^ D[x];
        }
    }
}